

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataHolder.hpp
# Opt level: O1

void __thiscall OpenMD::DataHolder::assign<double>(DataHolder *this,string *keyword,double val)

{
  char cVar1;
  iterator iVar2;
  iterator iVar3;
  ostream *poVar4;
  OpenMDException *pOVar5;
  stringstream ss;
  string local_1d0;
  double local_1b0;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  local_1b0 = val;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::find(&(this->parameters_)._M_t,keyword);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->parameters_)._M_t._M_impl.super__Rb_tree_header) {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->deprecatedKeywords_)._M_t,keyword);
    if ((_Rb_tree_header *)iVar3._M_node !=
        &(this->deprecatedKeywords_)._M_t._M_impl.super__Rb_tree_header) {
      snprintf(painCave.errMsg,2000,
               "%s keyword has been deprecated in OpenMD. Please update your .omd file.\n",
               (keyword->_M_dataplus)._M_p);
      painCave.isFatal = 0;
      painCave.severity = 2;
      simError();
      return;
    }
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_198,(keyword->_M_dataplus)._M_p,keyword->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," is not a recognized keyword.\n",0x1e);
    pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    OpenMDException::OpenMDException(pOVar5,&local_1d0);
    __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  cVar1 = (**(code **)(**(long **)(iVar2._M_node + 2) + 0x30))(local_1b0);
  if (cVar1 != '\0') {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Error in parsing ",0x11);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,(keyword->_M_dataplus)._M_p,keyword->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,": expected ",0xb);
  (**(code **)(**(long **)(iVar2._M_node + 2) + 0x48))(&local_1d0);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," but got ",9);
  poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(pOVar5,&local_1d0);
  __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void assign(const std::string& keyword, T val) {
      ParamMap::iterator i = parameters_.find(keyword);
      if (i != parameters_.end()) {
        bool result = i->second->setData(val);
        if (!result) {
          std::stringstream ss;
          ss << "Error in parsing " << keyword << ": expected "
             << i->second->getParamType() << " but got " << &val << "\n";
          throw OpenMDException(ss.str());
        }
      } else if (deprecatedKeywords_.find(keyword) !=
                 deprecatedKeywords_.end()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "%s keyword has been deprecated in OpenMD. Please update your "
                 ".omd file.\n",
                 keyword.c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
      } else {
        std::stringstream ss;
        ss << keyword << " is not a recognized keyword.\n";
        throw OpenMDException(ss.str());
      }
    }